

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_32ce0a::Transaction::Transaction(Transaction *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Transaction_0025b350;
  in_memory_store::in_memory_store(&this->store_);
  pstore::database::database<pstore::file::in_memory>
            (&(this->db_).super_database,&(this->store_).file_,true);
  (this->db_).super_database._vptr_database = (_func_int **)&PTR__mock_database_0025b390;
  testing::internal::
  FunctionMocker<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
  FunctionMocker(&(this->db_).gmock14_get_51);
  testing::internal::FunctionMocker<pstore::address_(unsigned_long,_unsigned_int)>::FunctionMocker
            (&(this->db_).gmock02_allocate_52);
  (this->db_).super_database.vacuum_mode_ = disabled;
  return;
}

Assistant:

Transaction::Transaction ()
            : db_{store_.file ()} {
        db_.set_vacuum_mode (pstore::database::vacuum_mode::disabled);
    }